

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O2

int mriStep_NlsInit(ARKodeMem ark_mem)

{
  void *pvVar1;
  int iVar2;
  code *pcVar3;
  char *msgfmt;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,"ARKode::MRIStep","mriStep_NlsInit",
                    "Time step module memory is NULL.");
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x180) = 0;
    *(undefined8 *)((long)pvVar1 + 0x188) = 0;
    if (*(long *)((long)pvVar1 + 0x130) == 0) {
      pcVar3 = (SUNNonlinSolLSetupFn)0x0;
    }
    else {
      pcVar3 = mriStep_NlsLSetup;
    }
    iVar2 = SUNNonlinSolSetLSetupFn(*(SUNNonlinearSolver *)((long)pvVar1 + 0x90),pcVar3);
    if (iVar2 == 0) {
      if (*(long *)((long)pvVar1 + 0x138) == 0) {
        pcVar3 = (SUNNonlinSolLSolveFn)0x0;
      }
      else {
        pcVar3 = mriStep_NlsLSolve;
      }
      iVar2 = SUNNonlinSolSetLSolveFn(*(SUNNonlinearSolver *)((long)pvVar1 + 0x90),pcVar3);
      if (iVar2 == 0) {
        iVar2 = SUNNonlinSolInitialize(*(SUNNonlinearSolver *)((long)pvVar1 + 0x90));
        if (iVar2 == 0) {
          return 0;
        }
        msgfmt = "The nonlinear solver\'s init routine failed.";
      }
      else {
        msgfmt = "Setting linear solver solve function failed";
      }
    }
    else {
      msgfmt = "Setting the linear solver setup function failed";
    }
    arkProcessError(ark_mem,-0x16,"ARKode::MRIStep","mriStep_NlsInit",msgfmt);
    iVar2 = -0x1d;
  }
  return iVar2;
}

Assistant:

int mriStep_NlsInit(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_NlsInit", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* reset counters */
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* set the linear solver setup wrapper function */
  if (step_mem->lsetup)
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, mriStep_NlsLSetup);
  else
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "mriStep_NlsInit",
                    "Setting the linear solver setup function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (step_mem->lsolve)
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, mriStep_NlsLSolve);
  else
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "mriStep_NlsInit",
                    "Setting linear solver solve function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(step_mem->NLS);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "mriStep_NlsInit", MSG_NLS_INIT_FAIL);
    return(ARK_NLS_INIT_FAIL);
  }

  return(ARK_SUCCESS);
}